

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::Image::MultiContextRenderTests::addClearActions(MultiContextRenderTests *this)

{
  ModifyRenderbufferClearColor *this_00;
  LabeledActions *this_01;
  allocator<char> local_79;
  string local_78;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_58;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_48;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_38;
  Vec4 local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"renderbuffer_clear_color",&local_79);
  this_00 = (ModifyRenderbufferClearColor *)operator_new(0x18);
  local_28.m_data[0] = 0.8;
  local_28.m_data[1] = 0.2;
  local_28.m_data[2] = 0.9;
  local_28.m_data[3] = 1.0;
  GLES2ImageApi::ModifyRenderbufferClearColor::ModifyRenderbufferClearColor(this_00,&local_28);
  this_01 = &this->m_clearActions;
  local_38.m_data.ptr = (Action *)this_00;
  LabeledActions::add(this_01,&local_78,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_38);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"renderbuffer_clear_depth",&local_79);
  local_48.m_data.ptr = (Action *)operator_new(0x10);
  (local_48.m_data.ptr)->_vptr_Action = (_func_int **)&PTR__Action_01e10680;
  *(undefined4 *)&local_48.m_data.ptr[1]._vptr_Action = 0x3f400000;
  LabeledActions::add(this_01,&local_78,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_48);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_48);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"renderbuffer_clear_stencil",&local_79);
  local_58.m_data.ptr = (Action *)operator_new(0x10);
  (local_58.m_data.ptr)->_vptr_Action = (_func_int **)&PTR__Action_01e106c0;
  *(undefined4 *)&local_58.m_data.ptr[1]._vptr_Action = 0x61;
  LabeledActions::add(this_01,&local_78,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_58);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void MultiContextRenderTests::addClearActions (void)
{
	m_clearActions.add("renderbuffer_clear_color",		MovePtr<Action>(new GLES2ImageApi::ModifyRenderbufferClearColor(tcu::Vec4(0.8f, 0.2f, 0.9f, 1.0f))));
	m_clearActions.add("renderbuffer_clear_depth",		MovePtr<Action>(new GLES2ImageApi::ModifyRenderbufferClearDepth(0.75f)));
	m_clearActions.add("renderbuffer_clear_stencil",	MovePtr<Action>(new GLES2ImageApi::ModifyRenderbufferClearStencil(97)));
}